

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxList.cpp
# Opt level: O1

BoxList * __thiscall amrex::BoxList::surroundingNodes(BoxList *this)

{
  int *piVar1;
  pointer pBVar2;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> *__range1;
  pointer pBVar3;
  int i;
  long lVar4;
  
  __range1 = &this->m_lbox;
  pBVar2 = (this->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pBVar3 = (this->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                super__Vector_impl_data._M_start; pBVar3 != pBVar2; pBVar3 = pBVar3 + 1) {
    lVar4 = 0;
    do {
      if (((pBVar3->btype).itype >> ((uint)lVar4 & 0x1f) & 1) == 0) {
        piVar1 = (pBVar3->bigend).vect + lVar4;
        *piVar1 = *piVar1 + 1;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    (pBVar3->btype).itype = 7;
  }
  return (BoxList *)__range1;
}

Assistant:

BoxList&
BoxList::surroundingNodes () noexcept
{
    for (auto& bx : m_lbox)
    {
        bx.surroundingNodes();
    }
    return *this;
}